

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_file_system.cpp
# Opt level: O2

void __thiscall duckdb::PipeFile::~PipeFile(PipeFile *this)

{
  ~PipeFile(this);
  operator_delete(this);
  return;
}

Assistant:

explicit PipeFile(unique_ptr<FileHandle> child_handle_p)
	    : FileHandle(pipe_fs, child_handle_p->path, child_handle_p->GetFlags()),
	      child_handle(std::move(child_handle_p)) {
	}